

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

Vec_Int_t * Pdr_ManDeriveFlopPriorities3(Gia_Man_t *p,int fMuxCtrls)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Vec_Bit_t *p_01;
  Vec_Bit_t *p_02;
  Vec_Wec_t *p_03;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_04;
  int Entry;
  int Entry_00;
  int Entry_01;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pData1;
  byte local_40;
  undefined7 uStack_3f;
  byte local_38;
  undefined7 uStack_37;
  
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(p->nRegs);
  iVar8 = 0;
  iVar6 = 0;
  while ((iVar6 < p->nRegs &&
         (pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6), pGVar4 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjRefNum(p,pGVar4);
    Vec_IntPush(p_00,iVar2);
    iVar2 = Gia_ObjRefNum(p,pGVar4);
    if (iVar8 <= iVar2) {
      iVar8 = iVar2;
    }
    iVar6 = iVar6 + 1;
  }
  iVar8 = iVar8 + 1;
  if (fMuxCtrls != 0) {
    p_01 = Vec_BitStart(p->nObjs);
    p_02 = Vec_BitStart(p->nObjs);
    iVar6 = 0;
    while ((iVar6 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar6), pGVar4 != (Gia_Obj_t *)0x0))) {
      if (((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) &&
         (iVar2 = Gia_ObjIsMuxType(pGVar4), iVar2 != 0)) {
        pGVar4 = Gia_ObjRecognizeMux(pGVar4,(Gia_Obj_t **)&local_38,(Gia_Obj_t **)&local_40);
        local_38 = local_38 & 0xfe;
        local_40 = local_40 & 0xfe;
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar4 & 0xfffffffffffffffe));
        Vec_BitWriteEntry(p_01,iVar2,Entry);
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)CONCAT71(uStack_37,local_38));
        Vec_BitWriteEntry(p_02,iVar2,Entry_00);
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)CONCAT71(uStack_3f,local_40));
        Vec_BitWriteEntry(p_02,iVar2,Entry_01);
      }
      iVar6 = iVar6 + 1;
    }
    iVar6 = 0;
    while ((iVar6 < p->nRegs &&
           (pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6), pGVar4 != (Gia_Obj_t *)0x0)))
    {
      iVar2 = Gia_ObjId(p,pGVar4);
      iVar2 = Vec_BitEntry(p_01,iVar2);
      if (iVar2 != 0) {
        Vec_IntAddToEntry(p_00,iVar6,iVar8);
      }
      iVar6 = iVar6 + 1;
    }
    iVar8 = iVar8 * 2 + 1;
    Vec_BitFree(p_01);
    Vec_BitFree(p_02);
  }
  p_03 = Vec_WecStart(iVar8);
  iVar6 = 0;
  iVar8 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar8 = iVar6;
  }
  for (; iVar8 != iVar6; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar6);
    if (p_03->nSize <= iVar2) {
      iVar7 = iVar2 + 1;
      iVar3 = p_03->nSize * 2;
      if (iVar3 <= iVar7) {
        iVar3 = iVar7;
      }
      iVar1 = p_03->nCap;
      if (iVar1 < iVar3) {
        if (p_03->pArray == (Vec_Int_t *)0x0) {
          pVVar5 = (Vec_Int_t *)malloc((long)iVar3 << 4);
        }
        else {
          pVVar5 = (Vec_Int_t *)realloc(p_03->pArray,(long)iVar3 << 4);
        }
        p_03->pArray = pVVar5;
        memset(pVVar5 + iVar1,0,(long)(iVar3 - iVar1) << 4);
        p_03->nCap = iVar3;
      }
      p_03->nSize = iVar7;
    }
    pVVar5 = Vec_WecEntry(p_03,iVar2);
    Vec_IntPush(pVVar5,iVar6);
  }
  pVVar5 = Vec_IntStart(p->nRegs);
  iVar8 = p_03->nSize;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  iVar6 = 0;
  for (iVar2 = 0; iVar2 != iVar8; iVar2 = iVar2 + 1) {
    p_04 = Vec_WecEntry(p_03,iVar2);
    for (iVar7 = 0; iVar7 < p_04->nSize; iVar7 = iVar7 + 1) {
      iVar3 = Vec_IntEntry(p_04,iVar7);
      Vec_IntWriteEntry(pVVar5,iVar3,iVar6 + iVar7);
    }
    iVar6 = iVar6 + iVar7;
  }
  if (iVar6 != p->nRegs) {
    __assert_fail("MaxEntry == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrMan.c"
                  ,0x86,"Vec_Int_t *Pdr_ManDeriveFlopPriorities3(Gia_Man_t *, int)");
  }
  Vec_WecFree(p_03);
  Vec_IntFree(p_00);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return pVVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Structural analysis.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Pdr_ManDeriveFlopPriorities3( Gia_Man_t * p, int fMuxCtrls )
{
    int fDiscount = 0;
    Vec_Wec_t * vLevels;
    Vec_Int_t * vRes, * vLevel, * vCosts;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, k, Entry, MaxEntry = 0;
    Gia_ManCreateRefs(p);
    // discount references
    if ( fDiscount )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            p->pRefs[Gia_ObjId(p, pCtrl)]--;
            if ( pData0 == pData1 )
                p->pRefs[Gia_ObjId(p, pData0)]--;
        }
    }
    // create flop costs
    vCosts = Vec_IntAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Vec_IntPush( vCosts, Gia_ObjRefNum(p, pObj) );
        MaxEntry = Abc_MaxInt( MaxEntry, Gia_ObjRefNum(p, pObj) );
        //printf( "%d(%d) ", i, Gia_ObjRefNum(p, pObj) );
    }
    //printf( "\n" );
    MaxEntry++;
    // add costs due to MUX inputs
    if ( fMuxCtrls )
    {
        int fVerbose = 0;
        Vec_Bit_t * vCtrls = Vec_BitStart( Gia_ManObjNum(p) );
        Vec_Bit_t * vDatas = Vec_BitStart( Gia_ManObjNum(p) );
        Gia_Obj_t * pCtrl, * pData1, * pData0; 
        int nCtrls = 0, nDatas = 0, nBoth = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
            pCtrl  = Gia_Regular(pCtrl);
            pData1 = Gia_Regular(pData1);
            pData0 = Gia_Regular(pData0);
            Vec_BitWriteEntry( vCtrls, Gia_ObjId(p, pCtrl), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData1), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData0), 1 );
        }
        Gia_ManForEachRo( p, pObj, i )
            if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                Vec_IntAddToEntry( vCosts, i, MaxEntry );
            //else if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
            //    Vec_IntAddToEntry( vCosts, i,   MaxEntry );
        MaxEntry = 2*MaxEntry + 1;
        // print out
        if ( fVerbose )
        {
            Gia_ManForEachRo( p, pObj, i )
            {
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                    nCtrls++;
                if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nDatas++;
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) && Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nBoth++;
            }
            printf( "%10s : Flops = %5d.  Ctrls = %5d.  Datas = %5d.  Both = %5d.\n", Gia_ManName(p), Gia_ManRegNum(p), nCtrls, nDatas, nBoth );
        }
        Vec_BitFree( vCtrls );
        Vec_BitFree( vDatas );
    }
    // create levelized structure
    vLevels = Vec_WecStart( MaxEntry );
    Vec_IntForEachEntry( vCosts, Entry, i )
        Vec_WecPush( vLevels, Entry, i );
    // collect in this order
    MaxEntry = 0;
    vRes = Vec_IntStart( Gia_ManRegNum(p) );
    Vec_WecForEachLevel( vLevels, vLevel, i )
        Vec_IntForEachEntry( vLevel, Entry, k )
            Vec_IntWriteEntry( vRes, Entry, MaxEntry++ );
        //printf( "%d ", Gia_ObjRefNum(p, Gia_ManCi(p, Gia_ManPiNum(p)+Entry)) );
    //printf( "\n" );
    assert( MaxEntry == Gia_ManRegNum(p) );
    Vec_WecFree( vLevels );
    Vec_IntFree( vCosts );
    ABC_FREE( p->pRefs );
//Vec_IntPrint( vRes );
    return vRes;
}